

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::TypedAttributeWithFallback<tinyusdz::Purpose>::TypedAttributeWithFallback
          (TypedAttributeWithFallback<tinyusdz::Purpose> *this,
          TypedAttributeWithFallback<tinyusdz::Purpose> *param_1)

{
  undefined3 uVar1;
  Purpose PVar2;
  TypedAttributeWithFallback<tinyusdz::Purpose> *param_1_local;
  TypedAttributeWithFallback<tinyusdz::Purpose> *this_local;
  
  AttrMetas::AttrMetas(&this->_metas,&param_1->_metas);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&this->_paths,&param_1->_paths);
  nonstd::optional_lite::optional<tinyusdz::Purpose>::optional<tinyusdz::Purpose,_0>
            (&this->_attrib,&param_1->_attrib);
  uVar1 = *(undefined3 *)&param_1->field_0x229;
  PVar2 = param_1->_fallback;
  this->_empty = param_1->_empty;
  *(undefined3 *)&this->field_0x229 = uVar1;
  this->_fallback = PVar2;
  this->_blocked = param_1->_blocked;
  return;
}

Assistant:

static std::string type_name() { return value::TypeTraits<T>::type_name(); }